

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inLiteral(Tokenizer *this,char ch)

{
  string *__lhs;
  bool bVar1;
  token_type_e tVar2;
  
  bVar1 = is_delimiter(ch);
  if (bVar1) {
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
    __lhs = &this->raw_val;
    bVar1 = std::operator==(__lhs,"true");
    tVar2 = tt_bool;
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"false");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"null");
        tVar2 = (uint)!bVar1 * 2 + tt_null;
      }
    }
    this->type = tVar2;
  }
  return;
}

Assistant:

void
Tokenizer::inLiteral(char ch)
{
    if (isDelimiter(ch)) {
        // A C-locale whitespace character or delimiter terminates token.  It is important to unread
        // the whitespace character even though it is ignored since it may be the newline after a
        // stream keyword.  Removing it here could make the stream-reading code break on some files,
        // though not on any files in the test suite as of this writing.

        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
        type = (raw_val == "true") || (raw_val == "false")
            ? tt::tt_bool
            : (raw_val == "null" ? tt::tt_null : tt::tt_word);
    }
}